

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

string * __thiscall
flatbuffers::cpp::CppGenerator::Name_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,FieldDef *field)

{
  BaseType BVar1;
  CaseStyle CVar2;
  pointer pcVar3;
  string name;
  string local_68;
  string local_48;
  
  if (Name[abi:cxx11](flatbuffers::FieldDef_const&)::union_suffix_len == '\0') {
    Name_abi_cxx11_();
  }
  if ((this->opts_).super_IDLOptions.cpp_object_api_field_case_style == CaseStyle_Unchanged) {
    EscapeKeyword(__return_storage_ptr__,this,(string *)field);
    return __return_storage_ptr__;
  }
  BVar1 = (field->value).type.base_type;
  pcVar3 = (field->super_Definition).name._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (field->super_Definition).name._M_string_length);
  if (BVar1 == BASE_TYPE_UTYPE) {
    if (local_68._M_string_length < Name::union_suffix_len ||
        local_68._M_string_length - Name::union_suffix_len == 0) {
      __assert_fail("name.length() > union_suffix_len",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                    ,0x155,
                    "std::string flatbuffers::cpp::CppGenerator::Name(const FieldDef &) const");
    }
    std::__cxx11::string::erase((ulong)&local_68,local_68._M_string_length - Name::union_suffix_len)
    ;
  }
  CVar2 = (this->opts_).super_IDLOptions.cpp_object_api_field_case_style;
  if (CVar2 == CaseStyle_Lower) {
    ConvertCase(&local_48,&local_68,kLowerCamel,kSnake);
  }
  else {
    if (CVar2 != CaseStyle_Upper) goto LAB_0017e08c;
    ConvertCase(&local_48,&local_68,kUpperCamel,kSnake);
  }
  std::__cxx11::string::operator=((string *)&local_68,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
LAB_0017e08c:
  if (BVar1 == BASE_TYPE_UTYPE) {
    std::__cxx11::string::append((char *)&local_68,0x3675a0);
  }
  EscapeKeyword(__return_storage_ptr__,this,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Name(const FieldDef &field) const {
    // the union type field suffix is immutable.
    static size_t union_suffix_len = strlen(UnionTypeFieldSuffix());
    const bool is_union_type = field.value.type.base_type == BASE_TYPE_UTYPE;
    // early return if no case transformation required
    if (opts_.cpp_object_api_field_case_style ==
        IDLOptions::CaseStyle_Unchanged)
      return EscapeKeyword(field.name);
    std::string name = field.name;
    // do not change the case style of the union type field suffix
    if (is_union_type) {
      FLATBUFFERS_ASSERT(name.length() > union_suffix_len);
      name.erase(name.length() - union_suffix_len, union_suffix_len);
    }
    if (opts_.cpp_object_api_field_case_style == IDLOptions::CaseStyle_Upper)
      name = ConvertCase(name, Case::kUpperCamel);
    else if (opts_.cpp_object_api_field_case_style ==
             IDLOptions::CaseStyle_Lower)
      name = ConvertCase(name, Case::kLowerCamel);
    // restore the union field type suffix
    if (is_union_type) name.append(UnionTypeFieldSuffix(), union_suffix_len);
    return EscapeKeyword(name);
  }